

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseBlock(Parser *this)

{
  bool bVar1;
  
  if (this->m_error != false) {
    return;
  }
  ScopeBegin(this);
  while( true ) {
    bVar1 = Check(this,End);
    if (bVar1) break;
    bVar1 = Check(this,Else);
    if (bVar1) break;
    bVar1 = Check(this,Until);
    if (bVar1) break;
    bVar1 = Check(this,While);
    if ((bVar1) || (this->m_error != false)) break;
    ParseStatement(this);
  }
  ScopeEnd(this);
  return;
}

Assistant:

inline_t void Parser::ParseBlock()
	{
		if (m_error)
			return;

		// Push local variable stack frame
		ScopeBegin();

		// Parse each statement until we reach a terminating symbol
		while (!(Check(SymbolType::End) || Check(SymbolType::Else) || Check(SymbolType::Until) || Check(SymbolType::While)) && !m_error)
			ParseStatement();

		// Pop local variable stack frame
		ScopeEnd();
	}